

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorType.cpp
# Opt level: O0

bool __thiscall Kernel::OperatorType::isSingleSortType(OperatorType *this,TermList srt)

{
  bool bVar1;
  bool bVar2;
  OperatorType *in_RDI;
  uint i;
  uint len;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  TermList in_stack_ffffffffffffffd0;
  TermList local_28;
  uint local_20;
  uint local_1c;
  TermList local_10 [2];
  
  local_1c = arity((OperatorType *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  local_20 = 0;
  while( true ) {
    if (local_1c <= local_20) {
      bVar2 = isFunctionType((OperatorType *)in_stack_ffffffffffffffd0._content);
      bVar1 = false;
      if (bVar2) {
        result(in_RDI);
        bVar1 = TermList::operator!=((TermList *)&stack0xffffffffffffffd0,local_10);
      }
      return bVar1 == false;
    }
    local_28 = arg(in_RDI,in_stack_ffffffffffffffc4);
    bVar1 = TermList::operator!=(&local_28,local_10);
    if (bVar1) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool OperatorType::isSingleSortType(TermList srt) const
{
  unsigned len = arity();
  for (unsigned i = 0; i <len; i++) {
    if (arg(i) != srt) { //term comparison with != should be OK on the basis that both are shared terms
      return false;
    }
  }

  if (isFunctionType() && result() != srt) { 
    return false;
  }

  return true;
}